

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O2

void __thiscall
wasm::SuffixTreeTest_TestSingleCharacterRepeat_Test::TestBody
          (SuffixTreeTest_TestSingleCharacterRepeat_Test *this)

{
  pointer puVar1;
  uint *puVar2;
  pointer pRVar3;
  difference_type __d;
  ulong uVar4;
  pointer pRVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  pointer puVar10;
  char *pcVar11;
  pointer puVar12;
  char *in_R9;
  pointer *this_00;
  uint *puVar13;
  initializer_list<unsigned_int> __l;
  RepeatedSubstringIterator local_260;
  undefined8 uStack_218;
  SuffixTree ST;
  SuffixTreeInternalNode *local_130;
  undefined1 local_110 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedRepetitionData;
  AssertionResult gtest_ar_;
  undefined1 local_a0 [8];
  iterator It;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  SubStrings;
  AssertHelper local_38;
  
  uStack_218 = 0x100000001;
  _ST = 1;
  __l._M_len = 7;
  __l._M_array = (iterator)&uStack_218;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,__l,
             (allocator_type *)local_a0);
  ::wasm::SuffixTree::SuffixTree((SuffixTree *)&uStack_218,(vector *)local_110);
  It.MinLength = 0;
  It._68_4_ = 0;
  SubStrings.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SubStrings.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)local_a0,local_130);
  while( true ) {
    RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    lVar6 = CONCAT71(local_a0._1_7_,local_a0[0]);
    SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator
              ((RepeatedSubstringIterator *)
               &RepeatedRepetitionData.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (lVar6 == 0) break;
    std::
    vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
    ::push_back((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                 *)&It.MinLength,(value_type *)&It);
    SuffixTree::RepeatedSubstringIterator::operator++
              (&local_260,(RepeatedSubstringIterator *)local_a0,0);
    SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator(&local_260);
  }
  SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)local_a0);
  RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((long)SubStrings.
                       super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                       ._M_impl.super__Vector_impl_data._M_start - It._64_8_ >> 5);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_a0,"SubStrings.size()","1u",
             (unsigned_long *)
             &RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint *)&local_38);
  if (local_a0[0] == (allocator_type)0x0) {
    testing::Message::Message
              ((Message *)
               &RepeatedRepetitionData.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (It.N == (SuffixTreeNode *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)It.N;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
               ,0x5f,pcVar11);
    testing::internal::AssertHelper::operator=
              (&local_38,
               (Message *)
               &RepeatedRepetitionData.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(*(long *)RepeatedRepetitionData.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&It);
  pRVar3 = SubStrings.
           super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar5 = (pointer)It._64_8_;
  do {
    this_00 = &RepeatedRepetitionData.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    if (pRVar5 == pRVar3) {
LAB_001d6f39:
      std::
      vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                 *)&It.MinLength);
      SuffixTree::~SuffixTree((SuffixTree *)&uStack_218);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
      return;
    }
    RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)(pRVar5->StartIndices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pRVar5->StartIndices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
    local_38.data_ =
         (AssertHelperData *)
         (((long)RepeatedRepetitionData.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start - (long)local_110 >> 2) - (ulong)pRVar5->Length);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_a0,"RS.StartIndices.size()",
               "RepeatedRepetitionData.size() - RS.Length",(unsigned_long *)this_00,
               (unsigned_long *)&local_38);
    if (local_a0[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar11 = "";
      if (It.N != (SuffixTreeNode *)0x0) {
        pcVar11 = *(char **)It.N;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                 ,0x62,pcVar11);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        (**(code **)(*(long *)RepeatedRepetitionData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&It);
    puVar2 = *(uint **)(It._64_8_ + 0x10);
    for (puVar13 = *(uint **)(It._64_8_ + 8); puVar13 != puVar2; puVar13 = puVar13 + 1) {
      uVar4 = (ulong)*puVar13;
      uVar8 = (ulong)(*(int *)It._64_8_ + *puVar13);
      lVar7 = uVar8 * 4 + uVar4 * -4;
      puVar1 = (pointer)((long)local_110 + uVar8 * 4);
      lVar6 = 0;
      for (lVar9 = lVar7 >> 4; 0 < lVar9; lVar9 = lVar9 + -1) {
        if (*(int *)((long)local_110 + lVar6 + uVar4 * 4) != 1) {
          puVar12 = (pointer)((long)local_110 + lVar6 + uVar4 * 4);
          goto LAB_001d6e53;
        }
        if (*(int *)((long)local_110 + lVar6 + uVar4 * 4 + 4) != 1) {
          puVar12 = (pointer)((long)local_110 + lVar6 + uVar4 * 4 + 4);
          goto LAB_001d6e53;
        }
        if (*(int *)((long)local_110 + lVar6 + uVar4 * 4 + 8) != 1) {
          puVar12 = (pointer)((long)local_110 + lVar6 + uVar4 * 4 + 8);
          goto LAB_001d6e53;
        }
        if (*(int *)((long)local_110 + lVar6 + uVar4 * 4 + 0xc) != 1) {
          puVar12 = (pointer)((long)local_110 + lVar6 + uVar4 * 4 + 0xc);
          goto LAB_001d6e53;
        }
        lVar6 = lVar6 + 0x10;
      }
      lVar7 = lVar7 - lVar6 >> 2;
      puVar10 = (pointer)((long)local_110 + lVar6 + uVar4 * 4);
      if (lVar7 == 1) {
LAB_001d6e49:
        puVar12 = puVar10;
        if (*puVar10 == 1) {
          puVar12 = puVar1;
        }
      }
      else if (lVar7 == 3) {
        puVar12 = puVar10;
        if (*puVar10 == 1) {
          puVar10 = (pointer)((long)local_110 + lVar6 + uVar4 * 4 + 4);
          goto LAB_001d6e40;
        }
      }
      else {
        puVar12 = puVar1;
        if (lVar7 == 2) {
LAB_001d6e40:
          puVar12 = puVar10;
          if (*puVar10 == 1) {
            puVar10 = puVar10 + 1;
            goto LAB_001d6e49;
          }
        }
      }
LAB_001d6e53:
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(RepeatedRepetitionData.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._1_7_,puVar12 == puVar1);
      if (puVar12 != puVar1) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,
                   (internal *)
                   &RepeatedRepetitionData.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (AssertionResult *)
                   "all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2), [](unsigned Elt) { return Elt == 1; })"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &SubStrings.
                    super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                   ,0x69,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &SubStrings.
                    super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &SubStrings.
                    super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)local_a0);
        if (local_38.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_38.data_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar_);
        goto LAB_001d6f39;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
    }
    pRVar5 = pRVar5 + 1;
  } while( true );
}

Assistant:

TEST(SuffixTreeTest, TestSingleCharacterRepeat) {
  std::vector<unsigned> RepeatedRepetitionData = {1, 1, 1, 1, 1, 1, 2};
  std::vector<unsigned>::iterator RRDIt, RRDIt2;
  SuffixTree ST(RepeatedRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  EXPECT_EQ(SubStrings.size(), 1u);
  for (SuffixTree::RepeatedSubstring& RS : SubStrings) {
    EXPECT_EQ(RS.StartIndices.size(),
              RepeatedRepetitionData.size() - RS.Length);
    for (unsigned StartIdx : SubStrings[0].StartIndices) {
      RRDIt = RRDIt2 = RepeatedRepetitionData.begin();
      std::advance(RRDIt, StartIdx);
      std::advance(RRDIt2, StartIdx + SubStrings[0].Length);
      ASSERT_TRUE(
        all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2),
               [](unsigned Elt) { return Elt == 1; }));
    }
  }
}